

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O0

Builder __thiscall capnproto_test::capnp::test::TestDefaults::Builder::getDataField(Builder *this)

{
  PointerBuilder builder;
  uint ptrIndex;
  ArrayPtr<unsigned_char> AVar1;
  PointerBuilder local_38;
  Builder *local_20;
  Builder *this_local;
  
  local_20 = this;
  ptrIndex = ::capnp::bounded<1u>();
  ::capnp::_::StructBuilder::getPointerField(&local_38,&this->_builder,ptrIndex);
  builder.capTable = local_38.capTable;
  builder.segment = local_38.segment;
  builder.pointer = local_38.pointer;
  AVar1 = (ArrayPtr<unsigned_char>)
          ::capnp::_::PointerHelpers<capnp::Data,_(capnp::Kind)1>::get(builder,&DAT_00a139b8,3);
  return (Builder)AVar1;
}

Assistant:

inline  ::capnp::Data::Builder TestDefaults::Builder::getDataField() {
  return ::capnp::_::PointerHelpers< ::capnp::Data>::get(_builder.getPointerField(
      ::capnp::bounded<1>() * ::capnp::POINTERS),
        ::capnp::schemas::bp_eb3f9ebe98c73cb6 + 384, 3);
}